

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O1

ForStreamable<nonstd::expected_lite::expected<int,_int>,_std::string> * __thiscall
lest::make_string<nonstd::expected_lite::expected<int,int>>
          (ForStreamable<nonstd::expected_lite::expected<int,_int>,_std::string>
           *__return_storage_ptr__,lest *this,expected<int,_int> *item)

{
  ostringstream os;
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  operator<<((ostream *)local_190,(expected<int,_int> *)this);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

auto make_string( T const & item ) -> ForStreamable<T, std::string>
{
    std::ostringstream os; os << item; return os.str();
}